

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void __thiscall hwnet::ThreadPool::TaskQueue::PostTask(TaskQueue *this,Ptr *task)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  Ptr *task_local;
  TaskQueue *this_local;
  
  guard._M_device = (mutex_type *)task;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mtx);
  if (((this->closed & 1U) == 0) &&
     (std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
      push_back(&this->tasks,(value_type *)guard._M_device), 0 < this->watting)) {
    std::_V2::condition_variable_any::notify_one(&this->cv);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void ThreadPool::TaskQueue::PostTask(const Task::Ptr &task) {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(this->closed) {
		return;
	}	
	this->tasks.push_back(task);
	if(this->watting > 0) {
		this->cv.notify_one();
	}
}